

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiContextHook *pIVar4;
  _func_void_int_int *p_Var5;
  char *__s1;
  ImGuiWindow **ppIVar6;
  unsigned_short *puVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImGuiID key;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar11;
  ImGuiWindow **ppIVar12;
  unsigned_short *__dest;
  byte bVar13;
  uint uVar14;
  char *pcVar15;
  char *label;
  ImGuiContext *g;
  byte bVar16;
  int iVar17;
  ImGuiContext *g_2;
  ulong uVar18;
  int clip_dir;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImRect local_48;
  
  pIVar10 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1096,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x109b,"void ImGui::EndFrame()");
  }
  iVar17 = (GImGui->Hooks).Size;
  if (0 < iVar17) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      pIVar4 = (pIVar10->Hooks).Data;
      if (*(int *)(pIVar4 + lVar19) == 2) {
        (**(code **)(pIVar4 + lVar19 + 8))(pIVar10,pIVar4 + lVar19);
        iVar17 = (pIVar10->Hooks).Size;
      }
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar20 < iVar17);
  }
  bVar3 = (GImGui->IO).KeyCtrl;
  uVar14 = bVar3 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar14 = (uint)bVar3;
  }
  uVar22 = uVar14 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar22 = uVar14;
  }
  uVar14 = uVar22 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar14 = uVar22;
  }
  if ((uVar14 != 0) && ((GImGui->IO).KeyMods != uVar14)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1b53,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar17 = (GImGui->CurrentWindowStack).Size;
  if (iVar17 != 1) {
    if (1 < iVar17) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x1b5f,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1b65,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((GImGui->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1b69,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var5 = (pIVar10->IO).ImeSetInputScreenPosFn;
  if (p_Var5 != (_func_void_int_int *)0x0) {
    fVar25 = (pIVar10->PlatformImeLastPos).x;
    if ((fVar25 != 3.4028235e+38) || (NAN(fVar25))) {
      fVar24 = (pIVar10->PlatformImePos).x;
      fVar23 = (pIVar10->PlatformImePos).y;
      fVar26 = (pIVar10->PlatformImeLastPos).y - fVar23;
      if ((fVar25 - fVar24) * (fVar25 - fVar24) + fVar26 * fVar26 <= 0.0001) goto LAB_00123744;
    }
    else {
      fVar24 = (pIVar10->PlatformImePos).x;
      fVar23 = (pIVar10->PlatformImePos).y;
    }
    (*p_Var5)((int)fVar24,(int)fVar23);
    pIVar10->PlatformImeLastPos = pIVar10->PlatformImePos;
  }
LAB_00123744:
  pIVar10->WithinFrameScopeWithImplicitWindow = false;
  pIVar11 = pIVar10->CurrentWindow;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
    pIVar11->Active = false;
  }
  End();
  pIVar9 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar11 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar9->WindowsById,key);
      pIVar9->NavWindowingListWindow = pIVar11;
    }
    IVar2 = (pIVar9->IO).DisplaySize;
    fVar25 = IVar2.x;
    fVar24 = IVar2.y;
    IVar8.y = fVar24 * 0.2;
    IVar8.x = fVar25 * 0.2;
    (pIVar9->NextWindowData).SizeConstraintRect.Min = IVar8;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar9->NextWindowData).SizeCallbackUserData = (void *)0x0;
    *(byte *)&(pIVar9->NextWindowData).Flags = (byte)(pIVar9->NextWindowData).Flags | 0x11;
    IVar2.y = fVar24 * 0.5;
    IVar2.x = fVar25 * 0.5;
    (pIVar9->NextWindowData).PosVal = IVar2;
    (pIVar9->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar9->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar9->NextWindowData).PosCond = 1;
    IVar2 = (pIVar9->Style).WindowPadding;
    fVar25 = IVar2.x;
    fVar24 = IVar2.y;
    local_48.Min.y = fVar24 + fVar24;
    local_48.Min.x = fVar25 + fVar25;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar19 = (long)(pIVar9->WindowsFocusOrder).Size;
    if (0 < lVar19) {
      do {
        if ((pIVar9->WindowsFocusOrder).Size < lVar19) goto LAB_00123fc8;
        pIVar11 = (pIVar9->WindowsFocusOrder).Data[lVar19 + -1];
        if (((pIVar11->WasActive == true) && (pIVar11->RootWindow == pIVar11)) &&
           (uVar14 = pIVar11->Flags, (uVar14 >> 0x13 & 1) == 0)) {
          __s1 = pIVar11->Name;
          pcVar15 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00123905:
            label = "(Popup)";
            if ((uVar14 >> 0x1a & 1) == 0) {
              if ((uVar14 >> 10 & 1) != 0) {
                iVar17 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar17 == 0) goto LAB_00123936;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar15 == '#') {
                if (pcVar15[1] == '#') goto LAB_001238fb;
              }
              else if (*pcVar15 == '\0') goto LAB_001238fb;
              pcVar15 = pcVar15 + 1;
            } while (pcVar15 != (char *)0xffffffffffffffff);
            pcVar15 = (char *)0xffffffffffffffff;
LAB_001238fb:
            label = __s1;
            if (__s1 == pcVar15) goto LAB_00123905;
          }
LAB_00123936:
          local_48.Min.x = 0.0;
          local_48.Min.y = 0.0;
          Selectable(label,pIVar9->NavWindowingTarget == pIVar11,0,&local_48.Min);
        }
        bVar3 = 1 < lVar19;
        lVar19 = lVar19 + -1;
      } while (bVar3);
    }
    End();
    PopStyleVar(1);
  }
  pIVar11 = pIVar9->NavWrapRequestWindow;
  if (((((pIVar11 != (ImGuiWindow *)0x0) && (pIVar9->NavWindow == pIVar11)) &&
       ((GImGui->NavMoveRequest == true &&
        (((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)))))) &&
      (pIVar9->NavMoveRequestForward == ImGuiNavForward_None)) &&
     (pIVar9->NavLayer == ImGuiNavLayer_Main)) {
    uVar14 = pIVar9->NavWrapRequestFlags;
    if (uVar14 == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x2413,"void ImGui::NavEndFrame()");
    }
    local_48.Min = pIVar11->NavRectRel[0].Min;
    local_48.Max = pIVar11->NavRectRel[0].Max;
    iVar17 = pIVar9->NavMoveDir;
    clip_dir = iVar17;
    if (iVar17 == 0) {
      if ((uVar14 & 5) == 0) goto LAB_00123c1a;
      fVar25 = (pIVar11->SizeFull).x;
      fVar24 = (pIVar11->WindowPadding).x;
      fVar24 = fVar24 + fVar24 + (pIVar11->ContentSize).x;
      uVar22 = -(uint)(fVar24 <= fVar25);
      fVar25 = (float)(uVar22 & (uint)fVar25 | ~uVar22 & (uint)fVar24) - (pIVar11->Scroll).x;
      clip_dir = 0;
      if ((uVar14 & 4) != 0) {
        fVar24 = local_48.Max.y - local_48.Min.y;
        local_48.Min.y = local_48.Min.y - fVar24;
        local_48.Max.y = local_48.Max.y - fVar24;
        clip_dir = 2;
      }
      local_48.Max.x = fVar25;
      local_48.Min.x = fVar25;
      NavMoveRequestForward(0,clip_dir,&local_48,uVar14);
      iVar17 = pIVar9->NavMoveDir;
    }
    if (iVar17 == 1 && (uVar14 & 5) != 0) {
      fVar25 = (pIVar11->Scroll).x;
      fVar23 = local_48.Max.y;
      local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar25) ^ 0x80000000);
      fVar24 = local_48.Min.y;
      local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar25) ^ 0x80000000);
      if ((uVar14 & 4) != 0) {
        fVar25 = fVar23 - fVar24;
        local_48.Min.y = fVar24 + fVar25;
        local_48.Max.y = fVar25 + fVar23;
        clip_dir = 3;
      }
      NavMoveRequestForward(1,clip_dir,&local_48,uVar14);
      iVar17 = pIVar9->NavMoveDir;
    }
    if ((uVar14 & 10) != 0 && iVar17 == 2) {
      fVar25 = (pIVar11->SizeFull).y;
      fVar24 = (pIVar11->WindowPadding).y;
      fVar24 = fVar24 + fVar24 + (pIVar11->ContentSize).y;
      uVar22 = -(uint)(fVar24 <= fVar25);
      fVar25 = (float)(uVar22 & (uint)fVar25 | ~uVar22 & (uint)fVar24) - (pIVar11->Scroll).y;
      if ((uVar14 & 8) != 0) {
        fVar24 = local_48.Max.x - local_48.Min.x;
        local_48.Min.x = local_48.Min.x - fVar24;
        local_48.Max.x = local_48.Max.x - fVar24;
        clip_dir = 0;
      }
      local_48.Max.y = fVar25;
      local_48.Min.y = fVar25;
      NavMoveRequestForward(2,clip_dir,&local_48,uVar14);
      iVar17 = pIVar9->NavMoveDir;
    }
    if (iVar17 == 3 && (uVar14 & 10) != 0) {
      fVar25 = (pIVar11->Scroll).y;
      fVar23 = local_48.Max.x;
      local_48.Max = (ImVec2)(CONCAT44(fVar25,local_48.Max.x) ^ 0x8000000000000000);
      fVar24 = local_48.Min.x;
      local_48.Min = (ImVec2)(CONCAT44(fVar25,local_48.Min.x) ^ 0x8000000000000000);
      if ((uVar14 & 8) != 0) {
        fVar25 = fVar23 - fVar24;
        local_48.Min.x = fVar24 + fVar25;
        local_48.Max.x = fVar25 + fVar23;
        clip_dir = 1;
      }
      NavMoveRequestForward(3,clip_dir,&local_48,uVar14);
    }
  }
LAB_00123c1a:
  bVar13 = pIVar10->DragDropActive;
  iVar17 = pIVar10->FrameCount;
  if ((bool)bVar13 != true) goto LAB_00123c87;
  if ((pIVar10->DragDropPayload).DataFrameCount + 1 < iVar17) {
    if ((pIVar10->DragDropSourceFlags & 0x20) == 0) {
      if (4 < (ulong)(uint)pIVar10->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                      ,0x11be,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
      }
      bVar16 = (GImGui->IO).MouseDown[(uint)pIVar10->DragDropMouseButton] ^ 1;
      goto LAB_00123c6d;
    }
  }
  else {
    bVar16 = 0;
LAB_00123c6d:
    if ((bVar16 == 0) && ((pIVar10->DragDropPayload).Delivery == false)) goto LAB_00123c87;
  }
  ClearDragDrop();
  bVar13 = pIVar10->DragDropActive;
  iVar17 = pIVar10->FrameCount;
LAB_00123c87:
  if ((((bVar13 & 1) != 0) && (pIVar10->DragDropSourceFrameCount < iVar17)) &&
     ((pIVar10->DragDropSourceFlags & 1) == 0)) {
    pIVar10->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar10->DragDropWithinSource = false;
    iVar17 = pIVar10->FrameCount;
  }
  pIVar10->WithinFrameScope = false;
  pIVar10->FrameCountEnded = iVar17;
  UpdateMouseMovingWindowEndFrame();
  iVar17 = (pIVar10->WindowsTempSortBuffer).Capacity;
  if (iVar17 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    iVar17 = 0;
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar6,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
      ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar10->WindowsTempSortBuffer).Data = ppIVar12;
    (pIVar10->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar10->WindowsTempSortBuffer).Size = 0;
  uVar14 = (pIVar10->Windows).Size;
  uVar21 = (ulong)uVar14;
  if (iVar17 < (int)uVar14) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar21 * 8,GImAllocatorUserData);
    ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar6,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
      ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar10->WindowsTempSortBuffer).Data = ppIVar12;
    (pIVar10->WindowsTempSortBuffer).Capacity = uVar14;
    uVar21 = (ulong)(uint)(pIVar10->Windows).Size;
  }
  if ((int)uVar21 == 0) {
    iVar17 = 0;
  }
  else {
    uVar18 = 0;
    do {
      if ((long)(int)uVar21 <= (long)uVar18) {
LAB_00123fc8:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                      ,0x65c,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar11 = (pIVar10->Windows).Data[uVar18];
      if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar10->WindowsTempSortBuffer,pIVar11);
        uVar21 = (ulong)(uint)(pIVar10->Windows).Size;
      }
      uVar18 = uVar18 + 1;
      iVar17 = (int)uVar21;
    } while (uVar18 != uVar21);
  }
  if (iVar17 == (pIVar10->WindowsTempSortBuffer).Size) {
    (pIVar10->Windows).Size = iVar17;
    iVar17 = (pIVar10->WindowsTempSortBuffer).Capacity;
    (pIVar10->WindowsTempSortBuffer).Capacity = (pIVar10->Windows).Capacity;
    (pIVar10->Windows).Capacity = iVar17;
    ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
    (pIVar10->WindowsTempSortBuffer).Data = (pIVar10->Windows).Data;
    (pIVar10->Windows).Data = ppIVar6;
    (pIVar10->IO).MetricsActiveWindows = pIVar10->WindowsActiveCount;
    ((pIVar10->IO).Fonts)->Locked = false;
    (pIVar10->IO).MouseWheel = 0.0;
    (pIVar10->IO).MouseWheelH = 0.0;
    if ((pIVar10->IO).InputQueueCharacters.Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      puVar7 = (pIVar10->IO).InputQueueCharacters.Data;
      if (puVar7 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar7,(long)(pIVar10->IO).InputQueueCharacters.Size * 2);
        puVar7 = (pIVar10->IO).InputQueueCharacters.Data;
        if ((puVar7 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
      }
      (pIVar10->IO).InputQueueCharacters.Data = __dest;
      (pIVar10->IO).InputQueueCharacters.Capacity = 0;
    }
    (pIVar10->IO).InputQueueCharacters.Size = 0;
    (pIVar10->IO).NavInputs[0] = 0.0;
    (pIVar10->IO).NavInputs[1] = 0.0;
    (pIVar10->IO).NavInputs[2] = 0.0;
    (pIVar10->IO).NavInputs[3] = 0.0;
    (pIVar10->IO).NavInputs[4] = 0.0;
    (pIVar10->IO).NavInputs[5] = 0.0;
    (pIVar10->IO).NavInputs[6] = 0.0;
    (pIVar10->IO).NavInputs[7] = 0.0;
    (pIVar10->IO).NavInputs[8] = 0.0;
    (pIVar10->IO).NavInputs[9] = 0.0;
    (pIVar10->IO).NavInputs[10] = 0.0;
    (pIVar10->IO).NavInputs[0xb] = 0.0;
    (pIVar10->IO).NavInputs[0xc] = 0.0;
    (pIVar10->IO).NavInputs[0xd] = 0.0;
    (pIVar10->IO).NavInputs[0xe] = 0.0;
    (pIVar10->IO).NavInputs[0xf] = 0.0;
    (pIVar10->IO).NavInputs[0x10] = 0.0;
    (pIVar10->IO).NavInputs[0x11] = 0.0;
    (pIVar10->IO).NavInputs[0x12] = 0.0;
    (pIVar10->IO).NavInputs[0x13] = 0.0;
    (pIVar10->IO).NavInputs[0x14] = 0.0;
    iVar17 = (pIVar10->Hooks).Size;
    if (0 < iVar17) {
      lVar19 = 0;
      lVar20 = 0;
      do {
        pIVar4 = (pIVar10->Hooks).Data;
        if (*(int *)(pIVar4 + lVar19) == 3) {
          (**(code **)(pIVar4 + lVar19 + 8))(pIVar10,pIVar4 + lVar19);
          iVar17 = (pIVar10->Hooks).Size;
        }
        lVar20 = lVar20 + 1;
        lVar19 = lVar19 + 0x18;
      } while (lVar20 < iVar17);
    }
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x10d6,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}